

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::piece_passed(torrent *this,piece_index_t index)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var4;
  insert_iterator<std::set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  __result;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  peers;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> local_78
  ;
  undefined1 local_60 [8];
  _Rb_tree_color local_58 [2];
  _Base_ptr local_50;
  _Rb_tree_node_base *local_48;
  _Rb_tree_node_base *local_40;
  size_t local_38;
  undefined8 local_30;
  
  iVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar3 != '\0') {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"PIECE_PASSED (%d)",index.m_val);
  }
  bVar1 = (this->m_need_save_resume_data).m_val;
  if ((bVar1 & 0x10) == 0) {
    (this->m_need_save_resume_data).m_val = bVar1 | 0x10;
    state_updated(this);
  }
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x4b])();
  counters::inc_stats_counter((counters *)CONCAT44(extraout_var,iVar3),0x6b,1);
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_60 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar3) + 0x438);
  local_58[0] = local_58[0] & 0xffffff00;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
  local_58[0] = CONCAT31(local_58[0]._1_3_,true);
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 0x20c);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  if (iVar3 == 1) {
    add_suggest_piece(this,index);
  }
  piece_picker::get_downloaders
            (&local_78,
             (this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,index);
  local_58[0] = _S_red;
  local_50 = (_Base_ptr)0x0;
  local_38 = 0;
  local_30 = 0;
  __result.iter._M_node = (_Base_ptr)local_58;
  __result.container =
       (set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        *)local_60;
  local_48 = (_Base_ptr)local_58;
  local_40 = (_Base_ptr)local_58;
  ::std::
  __remove_copy_if<__gnu_cxx::__normal_iterator<libtorrent::aux::torrent_peer*const*,std::vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>>,std::insert_iterator<std::set<libtorrent::aux::torrent_peer*,std::less<libtorrent::aux::torrent_peer*>,std::allocator<libtorrent::aux::torrent_peer*>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::torrent_peer*const>>
            ((__normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
              )local_78.
               super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
              )local_78.
               super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,__result,
             (_Iter_equals_val<libtorrent::aux::torrent_peer_*const>)&local_30);
  p_Var4 = local_48;
  if (local_78.
      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (torrent_peer **)0x0) {
    operator_delete(local_78.
                    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    p_Var4 = local_48;
  }
  for (; p_Var4 != (_Base_ptr)local_58;
      p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
    lVar2 = *(long *)(p_Var4 + 1);
    if (lVar2 != 0) {
      *(uint *)(lVar2 + 0x1b) =
           *(uint *)(lVar2 + 0x1b) & 0xfbfe1fff | *(uint *)(lVar2 + 0x1b) + 0x2000 & 0x1e000;
      lVar2 = *(long *)(lVar2 + 8);
      if (lVar2 != 0) {
        (**(code **)(*(long *)(lVar2 + -0x80) + 0xa8))(lVar2 + -0x80,index.m_val);
      }
    }
  }
  piece_picker::piece_passed
            ((this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,index);
  update_gauge(this);
  we_have(this,index,false);
  remove_time_critical_piece(this,index,true);
  ::std::
  _Rb_tree<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*,_std::_Identity<libtorrent::aux::torrent_peer_*>,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ::~_Rb_tree((_Rb_tree<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*,_std::_Identity<libtorrent::aux::torrent_peer_*>,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)local_60);
  return;
}

Assistant:

void torrent::piece_passed(piece_index_t const index)
	{
//		INVARIANT_CHECK;
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(!m_picker->has_piece_passed(index));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("PIECE_PASSED (%d)", int(index));
#endif

//		std::fprintf(stderr, "torrent::piece_passed piece:%d\n", index);

		TORRENT_ASSERT(index >= piece_index_t(0));
		TORRENT_ASSERT(index < m_torrent_file->end_piece());

		set_need_save_resume(torrent_handle::if_download_progress);

		inc_stats_counter(counters::num_piece_passed);

		if (settings().get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache)
		{
			// we just got a new piece. Chances are that it's actually the
			// rarest piece (since we're likely to download pieces rarest first)
			// if it's rarer than any other piece that we currently suggest, insert
			// it in the suggest set and pop the last one out
			add_suggest_piece(index);
		}

		// increase the trust point of all peers that sent
		// parts of this piece.
		std::set<torrent_peer*> const peers = [&]
		{
			std::vector<torrent_peer*> const downloaders = m_picker->get_downloaders(index);

			std::set<torrent_peer*> ret;
			// these torrent_peer pointers are owned by m_peer_list and they may be
			// invalidated if a peer disconnects. We cannot keep them across any
			// significant operations, but we should use them right away
			// ignore nullptrs
			std::remove_copy(downloaders.begin(), downloaders.end()
				, std::inserter(ret, ret.begin()), static_cast<torrent_peer*>(nullptr));
			return ret;
		}();

		for (auto* p : peers)
		{
			TORRENT_ASSERT(p != nullptr);
			if (p == nullptr) continue;
			TORRENT_ASSERT(p->in_use);
			p->on_parole = false;
			int trust_points = p->trust_points;
			++trust_points;
			if (trust_points > 8) trust_points = 8;
			p->trust_points = trust_points;
			if (p->connection)
			{
				auto* peer = static_cast<peer_connection*>(p->connection);
				TORRENT_ASSERT(peer->m_in_use == 1337);
				peer->received_valid_data(index);
			}
		}

		m_picker->piece_passed(index);
		update_gauge();
		we_have(index);

#ifndef TORRENT_DISABLE_STREAMING
		remove_time_critical_piece(index, true);
#endif
	}